

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

bool __thiscall
cmMakefile::HaveStandardAvailable(cmMakefile *this,cmTarget *target,string *lang,string *feature)

{
  bool bVar1;
  
  bVar1 = std::operator==(lang,"C");
  if (bVar1) {
    bVar1 = HaveCStandardAvailable(this,target,feature);
    return bVar1;
  }
  bVar1 = HaveCxxStandardAvailable(this,target,feature);
  return bVar1;
}

Assistant:

bool cmMakefile::HaveStandardAvailable(cmTarget const* target,
                                       std::string const& lang,
                                       const std::string& feature) const
{
  return lang == "C" ? this->HaveCStandardAvailable(target, feature)
                     : this->HaveCxxStandardAvailable(target, feature);
}